

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall NLProblemBuilderTest_Forward_Test::TestBody(NLProblemBuilderTest_Forward_Test *this)

{
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *plVar1;
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *plVar2;
  linked_ptr_internal *plVar3;
  FunctionMocker<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this_00;
  FunctionMocker<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *this_01;
  FunctionMocker<BasicTestExpr<1>_(double)> *this_02;
  FunctionMocker<TestReference_(int)> *pFVar4;
  FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *this_03;
  FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_04;
  FunctionMocker<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_05;
  FunctionMocker<TestPLTermBuilder_(int)> *this_06;
  FunctionMocker<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this_07;
  FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_08;
  FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pFVar5;
  FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this_09;
  FunctionMocker<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *this_10;
  FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *this_11;
  FunctionMocker<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this_12;
  FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this_13;
  FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this_14;
  FunctionMocker<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this_15;
  FunctionMocker<BasicTestExpr<2>_(bool)> *this_16;
  FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)> *this_17;
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_18;
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_19;
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *this_20;
  FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_21;
  FunctionMocker<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_22;
  FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *this_23;
  FunctionMocker<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_24;
  FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *this_25;
  FunctionMocker<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_26;
  FunctionMocker<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *this_27;
  MockSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this_28;
  TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *this_29;
  MockSpec<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *this_30;
  TypedExpectation<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *this_31;
  MockSpec<BasicTestExpr<1>_(double)> *this_32;
  TypedExpectation<BasicTestExpr<1>_(double)> *this_33;
  MockSpec<TestReference_(int)> *pMVar6;
  TypedExpectation<TestReference_(int)> *pTVar7;
  MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *this_34;
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *this_35;
  MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_36;
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_37;
  MockSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_38;
  TypedExpectation<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_39
  ;
  MockSpec<TestPLTermBuilder_(int)> *this_40;
  TypedExpectation<TestPLTermBuilder_(int)> *this_41;
  MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this_42;
  TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *this_43;
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_44;
  TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_45;
  MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pMVar8;
  TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pTVar9;
  MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this_46;
  TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *this_47;
  MockSpec<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *this_48;
  TypedExpectation<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *this_49;
  MockSpec<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *this_50;
  TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *this_51;
  MockSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this_52;
  TypedExpectation<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this_53;
  MockSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this_54;
  TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this_55;
  MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this_56;
  TypedExpectation<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this_57;
  MockSpec<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this_58;
  TypedExpectation<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this_59;
  MockSpec<BasicTestExpr<2>_(bool)> *this_60;
  TypedExpectation<BasicTestExpr<2>_(bool)> *this_61;
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> *this_62;
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>)> *this_63;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_64;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_65;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_66;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_67;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *this_68;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *this_69;
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_70;
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this_71
  ;
  MockSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_72;
  TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_73;
  MockSpec<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *this_74;
  TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *this_75;
  MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_76;
  TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this_77;
  MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *this_78;
  TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *this_79;
  MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_80;
  TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_81;
  MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *this_82;
  TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *this_83
  ;
  BasicStringRef<char> value;
  Argument1 gmock_a1;
  BasicStringRef<char> value_00;
  Argument1 gmock_a1_00;
  BasicStringRef<char> value_01;
  Argument1 gmock_a1_01;
  StrictMock<MockProblemBuilder> builder;
  Matcher<BasicTestExpr<2>_> local_1cd8;
  Matcher<BasicTestExpr<0>_> local_1cc0;
  Matcher<BasicTestExpr<0>_> local_1ca8;
  linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
  local_1c90;
  StrictMock<MockProblemBuilder> local_1c80;
  
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  value.size_ = 3;
  value.data_ = "foo";
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)&local_1cd8,value);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cc0,2);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1ca8,0xb);
  this_00 = &local_1c80.super_MockProblemBuilder.gmock3_AddIntSuffix_249;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&local_1c80.super_MockProblemBuilder);
  this_28 = testing::internal::
            FunctionMocker<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::With
                      (this_00,(Matcher<fmt::BasicStringRef<char>_> *)&local_1cd8,
                       (Matcher<int> *)&local_1cc0,(Matcher<int> *)&local_1ca8);
  this_29 = testing::internal::MockSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>
            ::InternalExpectedAt
                      (this_28,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6b8,"builder","AddIntSuffix (str, mp::suf::OBJ, 11)");
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f96f0;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2a;
  local_1c90.link_.next_ = &local_1c90.link_;
  testing::internal::TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
  WillOnce(this_29,(Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)&local_1c90
          );
  testing::internal::
  linked_ptr<testing::ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>_>
  ::~linked_ptr(&local_1c90);
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3010;
  testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::
  ~linked_ptr((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
              &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  gmock_a1.size_ = 3;
  gmock_a1.data_ = "foo";
  MockProblemBuilder::AddIntSuffix(&local_1c80.super_MockProblemBuilder,gmock_a1,2,0xb);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  value_00.size_ = 3;
  value_00.data_ = "foo";
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)&local_1cd8,value_00);
  testing::Matcher<mp::suf::Kind>::Matcher((Matcher<mp::suf::Kind> *)&local_1cc0,OBJ);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1ca8,0xb);
  this_01 = &local_1c80.super_MockProblemBuilder.gmock3_AddDblSuffix_255;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_01,&local_1c80.super_MockProblemBuilder);
  this_30 = testing::internal::
            FunctionMocker<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::
            With(this_01,(Matcher<fmt::BasicStringRef<char>_> *)&local_1cd8,
                 (Matcher<mp::suf::Kind> *)&local_1cc0,(Matcher<int> *)&local_1ca8);
  this_31 = testing::internal::
            MockSpec<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::
            InternalExpectedAt(this_30,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6ba,"builder","AddDblSuffix (str, mp::suf::OBJ, 11)");
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f9890;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2a;
  local_1c90.link_.next_ = &local_1c90.link_;
  testing::internal::
  TypedExpectation<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::WillOnce
            (this_31,(Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *
                     )&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>_>
                 *)&local_1c90);
  plVar1 = &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)plVar1);
  plVar2 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3ab0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::suf::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::suf::Kind>_> *)plVar2);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3010;
  testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::
  ~linked_ptr((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
              &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  gmock_a1_00.size_ = 3;
  gmock_a1_00.data_ = "foo";
  MockProblemBuilder::AddDblSuffix(&local_1c80.super_MockProblemBuilder,gmock_a1_00,OBJ,0xb);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_1cd8,2.2);
  this_02 = &local_1c80.super_MockProblemBuilder.gmock1_MakeNumericConstant_260;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_02,&local_1c80.super_MockProblemBuilder);
  this_32 = testing::internal::FunctionMocker<BasicTestExpr<1>_(double)>::With
                      (this_02,(Matcher<double> *)&local_1cd8);
  this_33 = testing::internal::MockSpec<BasicTestExpr<1>_(double)>::InternalExpectedAt
                      (this_32,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6bd,"builder","MakeNumericConstant (2.2)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002f99c8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(double)>::WillOnce
            (this_33,(Action<BasicTestExpr<1>_(double)> *)&local_1cc0);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(double)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(double)>_> *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f2ce8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<double>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeNumericConstant(&local_1c80.super_MockProblemBuilder,2.2);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,0x21);
  pFVar4 = &local_1c80.super_MockProblemBuilder.gmock1_MakeVariable_261;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar4,&local_1c80.super_MockProblemBuilder);
  pMVar6 = testing::internal::FunctionMocker<TestReference_(int)>::With
                     (pFVar4,(Matcher<int> *)&local_1cd8);
  pTVar7 = testing::internal::MockSpec<TestReference_(int)>::InternalExpectedAt
                     (pMVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                      ,0x6be,"builder","MakeVariable (33)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002f9a60;
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       (_func_int **)0x2a00000000;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<TestReference_(int)>::WillOnce
            (pTVar7,(Action<TestReference_(int)> *)&local_1cc0);
  testing::internal::linked_ptr<testing::ActionInterface<TestReference_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestReference_(int)>_> *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeVariable(&local_1c80.super_MockProblemBuilder,0x21);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,0x21);
  pFVar4 = &local_1c80.super_MockProblemBuilder.gmock1_MakeCommonExpr_262;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar4,&local_1c80.super_MockProblemBuilder);
  pMVar6 = testing::internal::FunctionMocker<TestReference_(int)>::With
                     (pFVar4,(Matcher<int> *)&local_1cd8);
  pTVar7 = testing::internal::MockSpec<TestReference_(int)>::InternalExpectedAt
                     (pMVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                      ,0x6bf,"builder","MakeCommonExpr (33)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002f9a60;
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       (_func_int **)0x2a00000000;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<TestReference_(int)>::WillOnce
            (pTVar7,(Action<TestReference_(int)> *)&local_1cc0);
  testing::internal::linked_ptr<testing::ActionInterface<TestReference_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestReference_(int)>_> *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeCommonExpr(&local_1c80.super_MockProblemBuilder,0x21);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,ABS);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x2a);
  this_03 = &local_1c80.super_MockProblemBuilder.gmock2_MakeUnary_263;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_03,&local_1c80.super_MockProblemBuilder);
  this_34 = testing::internal::FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::
            With(this_03,(Matcher<mp::expr::Kind> *)&local_1cd8,
                 (Matcher<BasicTestExpr<1>_> *)&local_1cc0);
  this_35 = testing::internal::MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_34,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6c1,"builder","MakeUnary (expr::ABS, TestNumericExpr(ID))");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002f9c68;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::WillOnce
            (this_35,(Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)&local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>_>
               *)&local_1ca8);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeUnary(&local_1c80.super_MockProblemBuilder,ABS,(Argument2)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,ADD);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1ca8,(BasicTestExpr<1>)0x2b);
  this_04 = &local_1c80.super_MockProblemBuilder.gmock3_MakeBinary_266;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_04,&local_1c80.super_MockProblemBuilder);
  this_36 = testing::internal::
            FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            With(this_04,(Matcher<mp::expr::Kind> *)&local_1cd8,
                 (Matcher<BasicTestExpr<1>_> *)&local_1cc0,(Matcher<BasicTestExpr<1>_> *)&local_1ca8
                );
  this_37 = testing::internal::
            MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_36,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6c4,"builder",
                               "MakeBinary (expr::ADD, TestNumericExpr(ID), TestNumericExpr(ID2))");
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f9da0;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2c;
  local_1c90.link_.next_ = &local_1c90.link_;
  testing::internal::
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::WillOnce
            (this_37,(Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                      *)&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
                 *)&local_1c90);
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeBinary
            (&local_1c80.super_MockProblemBuilder,ADD,(Argument2)0x2a,(Argument3)0x2b);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<BasicTestExpr<2>_>::Matcher(&local_1cd8,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x2b);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1ca8,(BasicTestExpr<1>)0x2c);
  this_05 = &local_1c80.super_MockProblemBuilder.gmock3_MakeIf_270;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_05,&local_1c80.super_MockProblemBuilder);
  this_38 = testing::internal::
            FunctionMocker<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
            ::With(this_05,&local_1cd8,(Matcher<BasicTestExpr<1>_> *)&local_1cc0,
                   (Matcher<BasicTestExpr<1>_> *)&local_1ca8);
  this_39 = testing::internal::
            MockSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_38,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6c7,"builder",
                               "MakeIf (TestLogicalExpr(ID), TestNumericExpr(ID2), TestNumericExpr(ID3))"
                              );
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002f9f40;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2d;
  local_1c90.link_.next_ = &local_1c90.link_;
  testing::internal::
  TypedExpectation<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  WillOnce(this_39,(Action<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                    *)&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
                 *)&local_1c90);
  plVar1 = &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)plVar1);
  plVar2 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)plVar2);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            (&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeIf
            (&local_1c80.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x2b,(Argument3)0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,0x2c);
  this_06 = &local_1c80.super_MockProblemBuilder.gmock1_BeginPLTerm_274;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_06,&local_1c80.super_MockProblemBuilder);
  this_40 = testing::internal::FunctionMocker<TestPLTermBuilder_(int)>::With
                      (this_06,(Matcher<int> *)&local_1cd8);
  this_41 = testing::internal::MockSpec<TestPLTermBuilder_(int)>::InternalExpectedAt
                      (this_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6c9,"builder","BeginPLTerm (44)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002f9fd8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<TestPLTermBuilder_(int)>::WillOnce
            (this_41,(Action<TestPLTermBuilder_(int)> *)&local_1cc0);
  testing::internal::linked_ptr<testing::ActionInterface<TestPLTermBuilder_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestPLTermBuilder_(int)>_> *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginPLTerm(&local_1c80.super_MockProblemBuilder,0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestPLTermBuilder>::Matcher
            ((Matcher<TestPLTermBuilder> *)&local_1cd8,(TestPLTermBuilder)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x0);
  this_07 = &local_1c80.super_MockProblemBuilder.gmock2_EndPLTerm_275;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_07,&local_1c80.super_MockProblemBuilder);
  this_42 = testing::internal::
            FunctionMocker<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::With
                      (this_07,(Matcher<TestPLTermBuilder> *)&local_1cd8,
                       (Matcher<BasicTestExpr<1>_> *)&local_1cc0);
  this_43 = testing::internal::MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_42,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6cc,"builder",
                               "EndPLTerm (TestPLTermBuilder(ID), TestReference(ID2))");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa178;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2c;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
  WillOnce(this_43,(Action<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)&local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>_>
               *)&local_1ca8);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3c50;
  testing::internal::linked_ptr<const_testing::MatcherInterface<TestPLTermBuilder>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestPLTermBuilder>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndPLTerm(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x0)
  ;
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,LAST_VARARG);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cc0,0x4d);
  this_08 = &local_1c80.super_MockProblemBuilder.gmock2_BeginIterated_285;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_08,&local_1c80.super_MockProblemBuilder);
  this_44 = testing::internal::
            FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::With
                      (this_08,(Matcher<mp::expr::Kind> *)&local_1cd8,(Matcher<int> *)&local_1cc0);
  this_45 = testing::internal::MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
            ::InternalExpectedAt
                      (this_44,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6cf,"builder","BeginIterated (expr::MAX, 77)");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa2b0;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  WillOnce(this_45,(Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                   &local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
                 *)&local_1ca8);
  plVar2 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)plVar2);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginIterated(&local_1c80.super_MockProblemBuilder,LAST_VARARG,0x4d);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cd8,
             (TestExprBuilder<1,_BasicTestExpr<1>_>)0x2a);
  pFVar5 = &local_1c80.super_MockProblemBuilder.gmock1_EndIterated_286;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar5,&local_1c80.super_MockProblemBuilder);
  pMVar8 = testing::internal::
           FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::With
                     (pFVar5,(Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cd8);
  pTVar9 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
           InternalExpectedAt(pMVar8,
                              "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                              ,0x6d1,"builder","EndIterated (TestIteratedExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa450;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  WillOnce(pTVar9,(Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3cb8;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndIterated(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,0x58);
  this_09 = &local_1c80.super_MockProblemBuilder.gmock1_BeginSum_288;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_09,&local_1c80.super_MockProblemBuilder);
  this_46 = testing::internal::FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::With
                      (this_09,(Matcher<int> *)&local_1cd8);
  this_47 = testing::internal::MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::
            InternalExpectedAt(this_46,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6d4,"builder","BeginSum (88)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa4e8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::WillOnce
            (this_47,(Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>_> *)
             &local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginSum(&local_1c80.super_MockProblemBuilder,0x58);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cd8,
             (TestExprBuilder<1,_BasicTestExpr<1>_>)0x2a);
  pFVar5 = &local_1c80.super_MockProblemBuilder.gmock1_EndSum_289;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar5,&local_1c80.super_MockProblemBuilder);
  pMVar8 = testing::internal::
           FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::With
                     (pFVar5,(Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)&local_1cd8);
  pTVar9 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
           InternalExpectedAt(pMVar8,
                              "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                              ,0x6d6,"builder","EndSum (TestIteratedExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa450;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  WillOnce(pTVar9,(Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3cb8;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndSum(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,0xb);
  plVar3 = &local_1c90.link_;
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x2a);
  this_10 = &local_1c80.super_MockProblemBuilder.gmock2_BeginNumberOf_299;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_10,&local_1c80.super_MockProblemBuilder);
  this_48 = testing::internal::
            FunctionMocker<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::With
                      (this_10,(Matcher<int> *)&local_1cd8,(Matcher<BasicTestExpr<1>_> *)&local_1cc0
                      );
  this_49 = testing::internal::
            MockSpec<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_48,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6d9,"builder","BeginNumberOf (11, TestNumericExpr(ID))");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa620;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>
  ::WillOnce(this_49,(Action<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)
                     &local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>_>
                 *)&local_1ca8);
  plVar2 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)plVar2);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginNumberOf(&local_1c80.super_MockProblemBuilder,0xb,(Argument2)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)&local_1cd8,
             (TestExprBuilder<2,_BasicTestExpr<1>_>)0x2a);
  this_11 = &local_1c80.super_MockProblemBuilder.gmock1_EndNumberOf_300;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_11,&local_1c80.super_MockProblemBuilder);
  this_50 = testing::internal::
            FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::With
                      (this_11,(Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)&local_1cd8);
  this_51 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
            InternalExpectedAt(this_50,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6db,"builder","EndNumberOf (TestNumberOfExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa7c0;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
  WillOnce(this_51,(Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3d20;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndNumberOf(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,0xb);
  testing::Matcher<BasicTestExpr<0>_>::Matcher(&local_1cc0,(BasicTestExpr<0>)0x2a);
  this_12 = &local_1c80.super_MockProblemBuilder.gmock2_BeginSymbolicNumberOf_305;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_12,&local_1c80.super_MockProblemBuilder);
  this_52 = testing::internal::
            FunctionMocker<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::With
                      (this_12,(Matcher<int> *)&local_1cd8,&local_1cc0);
  this_53 = testing::internal::
            MockSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::
            InternalExpectedAt(this_52,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6de,"builder","BeginSymbolicNumberOf (11, TestExpr(ID))");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fa948;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>
  ::WillOnce(this_53,(Action<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)
                     &local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>_>
                 *)&local_1ca8);
  plVar1 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f2d50;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_>::~linked_ptr
            (plVar1);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginSymbolicNumberOf
            (&local_1c80.super_MockProblemBuilder,0xb,(Argument2)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>::Matcher
            ((Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)&local_1cd8,
             (TestExprBuilder<0,_BasicTestExpr<0>_>)0x2a);
  this_13 = &local_1c80.super_MockProblemBuilder.gmock1_EndSymbolicNumberOf_307;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_13,&local_1c80.super_MockProblemBuilder);
  this_54 = testing::internal::
            FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::With
                      (this_13,(Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)&local_1cd8);
  this_55 = testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
            InternalExpectedAt(this_54,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6e1,"builder",
                               "EndSymbolicNumberOf (TestSymbolicNumberOfExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002faae8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
  WillOnce(this_55,(Action<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3d88;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndSymbolicNumberOf(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cd8,99);
  this_14 = &local_1c80.super_MockProblemBuilder.gmock1_BeginCount_293;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_14,&local_1c80.super_MockProblemBuilder);
  this_56 = testing::internal::FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::With
                      (this_14,(Matcher<int> *)&local_1cd8);
  this_57 = testing::internal::MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::
            InternalExpectedAt(this_56,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6e3,"builder","BeginCount (99)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fab80;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::WillOnce
            (this_57,(Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>_> *)
             &local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginCount(&local_1c80.super_MockProblemBuilder,99);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>::Matcher
            ((Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)&local_1cd8,
             (TestExprBuilder<3,_BasicTestExpr<2>_>)0x2a);
  this_15 = &local_1c80.super_MockProblemBuilder.gmock1_EndCount_294;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_15,&local_1c80.super_MockProblemBuilder);
  this_58 = testing::internal::FunctionMocker<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>
            ::With(this_15,(Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)&local_1cd8);
  this_59 = testing::internal::MockSpec<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
            InternalExpectedAt(this_58,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6e5,"builder","EndCount (TestCountExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fad20;
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       (_func_int **)0x2b00000000;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
  WillOnce(this_59,(Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3df0;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndCount(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_1cd8,true);
  this_16 = &local_1c80.super_MockProblemBuilder.gmock1_MakeLogicalConstant_309;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_16,&local_1c80.super_MockProblemBuilder);
  this_60 = testing::internal::FunctionMocker<BasicTestExpr<2>_(bool)>::With
                      (this_16,(Matcher<bool> *)&local_1cd8);
  this_61 = testing::internal::MockSpec<BasicTestExpr<2>_(bool)>::InternalExpectedAt
                      (this_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6e7,"builder","MakeLogicalConstant (true)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002faec0;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<2>_(bool)>::WillOnce
            (this_61,(Action<BasicTestExpr<2>_(bool)> *)&local_1cc0);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(bool)>_> *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3e58;
  testing::internal::linked_ptr<const_testing::MatcherInterface<bool>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<bool>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            ((UntypedFunctionMockerBase *)this_16,&local_1c80.super_MockProblemBuilder,
             "MakeLogicalConstant");
  testing::internal::FunctionMocker<BasicTestExpr<2>_(bool)>::Invoke(this_16,true);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<BasicTestExpr<2>_>::Matcher(&local_1cd8,(BasicTestExpr<2>)0x2a);
  this_17 = &local_1c80.super_MockProblemBuilder.gmock1_MakeNot_310;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_17,&local_1c80.super_MockProblemBuilder);
  this_62 = testing::internal::FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)>::With
                      (this_17,&local_1cd8);
  this_63 = testing::internal::MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)>::InternalExpectedAt
                      (this_62,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6e9,"builder","MakeNot (TestLogicalExpr(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002faff8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>)>::WillOnce
            (this_63,(Action<BasicTestExpr<2>_(BasicTestExpr<2>)> *)&local_1cc0);
  testing::internal::linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>)>_> *)
              &local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            (&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeNot(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)&local_1cd8,FIRST_BINARY_LOGICAL);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1cc0,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1ca8,(BasicTestExpr<2>)0x2b);
  this_18 = &local_1c80.super_MockProblemBuilder.gmock3_MakeBinaryLogical_313;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_18,&local_1c80.super_MockProblemBuilder);
  this_64 = testing::internal::
            FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
            With(this_18,(Matcher<mp::expr::Kind> *)&local_1cd8,
                 (Matcher<BasicTestExpr<2>_> *)&local_1cc0,(Matcher<BasicTestExpr<2>_> *)&local_1ca8
                );
  this_65 = testing::internal::
            MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
            InternalExpectedAt(this_64,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6ec,"builder",
                               "MakeBinaryLogical (expr::OR, TestLogicalExpr(ID), TestLogicalExpr(ID2))"
                              );
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002fb130;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2c;
  local_1c90.link_.next_ = plVar3;
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::WillOnce
            (this_65,(Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                      *)&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
                 *)&local_1c90);
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
             &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeBinaryLogical
            (&local_1c80.super_MockProblemBuilder,FIRST_BINARY_LOGICAL,(Argument2)0x2a,
             (Argument3)0x2b);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,FIRST_RELATIONAL)
  ;
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x2a);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1ca8,(BasicTestExpr<1>)0x2b);
  this_19 = &local_1c80.super_MockProblemBuilder.gmock3_MakeRelational_316;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_19,&local_1c80.super_MockProblemBuilder);
  this_66 = testing::internal::
            FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            With(this_19,(Matcher<mp::expr::Kind> *)&local_1cd8,
                 (Matcher<BasicTestExpr<1>_> *)&local_1cc0,(Matcher<BasicTestExpr<1>_> *)&local_1ca8
                );
  this_67 = testing::internal::
            MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
            InternalExpectedAt(this_66,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6ef,"builder",
                               "MakeRelational (expr::LT, TestNumericExpr(ID), TestNumericExpr(ID2))"
                              );
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002fb1c8;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2c;
  local_1c90.link_.next_ = plVar3;
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::WillOnce
            (this_67,(Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                      *)&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>_>
                 *)&local_1c90);
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeRelational
            (&local_1c80.super_MockProblemBuilder,FIRST_RELATIONAL,(Argument2)0x2a,(Argument3)0x2b);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,ATLEAST);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)&local_1cc0,(BasicTestExpr<1>)0x2a);
  testing::Matcher<TestCountExpr>::Matcher
            ((Matcher<TestCountExpr> *)&local_1ca8,(TestCountExpr)0x2b00000000);
  this_20 = &local_1c80.super_MockProblemBuilder.gmock3_MakeLogicalCount_319;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_20,&local_1c80.super_MockProblemBuilder);
  this_68 = testing::internal::
            FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::With
                      (this_20,(Matcher<mp::expr::Kind> *)&local_1cd8,
                       (Matcher<BasicTestExpr<1>_> *)&local_1cc0,
                       (Matcher<TestCountExpr> *)&local_1ca8);
  this_69 = testing::internal::
            MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::
            InternalExpectedAt(this_68,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6f2,"builder",
                               "MakeLogicalCount (expr::ATLEAST, TestNumericExpr(ID), TestCountExpr(ID2))"
                              );
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002fb368;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2c;
  local_1c90.link_.next_ = plVar3;
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::WillOnce
            (this_69,(Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)
                     &local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
                 *)&local_1c90);
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3ec0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<TestCountExpr>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestCountExpr>_> *)
             &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b18;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeLogicalCount
            (&local_1c80.super_MockProblemBuilder,ATLEAST,(Argument2)0x2a,(Argument3)0x2b00000000);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<BasicTestExpr<2>_>::Matcher(&local_1cd8,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1cc0,(BasicTestExpr<2>)0x2b);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)&local_1ca8,(BasicTestExpr<2>)0x2c);
  this_21 = &local_1c80.super_MockProblemBuilder.gmock3_MakeImplication_322;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_21,&local_1c80.super_MockProblemBuilder);
  this_70 = testing::internal::
            FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
            ::With(this_21,&local_1cd8,(Matcher<BasicTestExpr<2>_> *)&local_1cc0,
                   (Matcher<BasicTestExpr<2>_> *)&local_1ca8);
  this_71 = testing::internal::
            MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
            InternalExpectedAt(this_70,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6f5,"builder",
                               "MakeImplication (TestLogicalExpr(ID), TestLogicalExpr(ID2), TestLogicalExpr(ID3))"
                              );
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002fb4a0;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2d;
  local_1c90.link_.next_ = plVar3;
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  WillOnce(this_71,(Action<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                    *)&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>_>
                 *)&local_1c90);
  plVar1 = &local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)plVar1);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
             &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            (&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeImplication
            (&local_1c80.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x2b,(Argument3)0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,EXISTS);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cc0,0x16);
  this_22 = &local_1c80.super_MockProblemBuilder.gmock2_BeginIteratedLogical_327;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_22,&local_1c80.super_MockProblemBuilder);
  this_72 = testing::internal::
            FunctionMocker<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::With
                      (this_22,(Matcher<mp::expr::Kind> *)&local_1cd8,(Matcher<int> *)&local_1cc0);
  this_73 = testing::internal::MockSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>
            ::InternalExpectedAt
                      (this_72,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6f8,"builder","BeginIteratedLogical (expr::EXISTS, 22)");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fb538;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
  WillOnce(this_73,(Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)
                   &local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>_>
                 *)&local_1ca8);
  plVar2 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)plVar2);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginIteratedLogical(&local_1c80.super_MockProblemBuilder,EXISTS,0x16);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>::Matcher
            ((Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)&local_1cd8,
             (TestExprBuilder<4,_BasicTestExpr<2>_>)0x2a);
  this_23 = &local_1c80.super_MockProblemBuilder.gmock1_EndIteratedLogical_329;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_23,&local_1c80.super_MockProblemBuilder);
  this_74 = testing::internal::
            FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::With
                      (this_23,(Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)&local_1cd8);
  this_75 = testing::internal::MockSpec<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
            InternalExpectedAt(this_74,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x6fb,"builder",
                               "EndIteratedLogical (TestIteratedLogicalExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fb6d8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar2;
  testing::internal::TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
  WillOnce(this_75,(Action<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3f28;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndIteratedLogical(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<mp::expr::Kind>::Matcher((Matcher<mp::expr::Kind> *)&local_1cd8,ALLDIFF);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_1cc0,0x21);
  this_24 = &local_1c80.super_MockProblemBuilder.gmock2_BeginPairwise_334;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_24,&local_1c80.super_MockProblemBuilder);
  this_76 = testing::internal::
            FunctionMocker<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::With
                      (this_24,(Matcher<mp::expr::Kind> *)&local_1cd8,(Matcher<int> *)&local_1cc0);
  this_77 = testing::internal::MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
            ::InternalExpectedAt
                      (this_76,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x6fe,"builder","BeginPairwise (expr::ALLDIFF, 33)");
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fb770;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
    local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  WillOnce(this_77,(Action<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                   &local_1ca8);
  testing::internal::
  linked_ptr<testing::ActionInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>_>
                 *)&local_1ca8);
  plVar1 = &local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)plVar1);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
             &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::BeginPairwise(&local_1c80.super_MockProblemBuilder,ALLDIFF,0x21);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)&local_1cd8,
             (TestExprBuilder<5,_BasicTestExpr<1>_>)0x2a);
  this_25 = &local_1c80.super_MockProblemBuilder.gmock1_EndPairwise_335;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_25,&local_1c80.super_MockProblemBuilder);
  this_78 = testing::internal::
            FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::With
                      (this_25,(Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)&local_1cd8);
  this_79 = testing::internal::MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
            InternalExpectedAt(this_78,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x700,"builder","EndPairwise (TestPairwiseExprBuilder(ID))");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fb910;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2b;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
  WillOnce(this_79,(Action<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>_>::
  ~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>_>
               *)&local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3f90;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_>_> *
             )&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::EndPairwise(&local_1c80.super_MockProblemBuilder,(Argument1)0x2a);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  value_01.size_ = 3;
  value_01.data_ = "foo";
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)&local_1cd8,value_01);
  this_26 = &local_1c80.super_MockProblemBuilder.gmock1_MakeStringLiteral_337;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_26,&local_1c80.super_MockProblemBuilder);
  this_80 = testing::internal::FunctionMocker<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::With
                      (this_26,(Matcher<fmt::BasicStringRef<char>_> *)&local_1cd8);
  this_81 = testing::internal::MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
            InternalExpectedAt(this_80,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x702,"builder","MakeStringLiteral (str)");
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)operator_new(0x10);
  ((ActionInterface<BasicTestExpr<1>_(double)> *)
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002fb9a8;
  *(undefined4 *)
   &((ActionInterface<BasicTestExpr<1>_(double)> *)
    local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       0x2a;
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_.value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)plVar1;
  testing::internal::TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::WillOnce
            (this_81,(Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)&local_1cc0);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>_> *)
             &local_1cc0);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3010;
  testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::
  ~linked_ptr((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
              &local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  gmock_a1_01.size_ = 3;
  gmock_a1_01.data_ = "foo";
  MockProblemBuilder::MakeStringLiteral(&local_1c80.super_MockProblemBuilder,gmock_a1_01);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  testing::StrictMock<MockProblemBuilder>::StrictMock(&local_1c80);
  testing::Matcher<BasicTestExpr<2>_>::Matcher(&local_1cd8,(BasicTestExpr<2>)0x2a);
  testing::Matcher<BasicTestExpr<0>_>::Matcher(&local_1cc0,(BasicTestExpr<0>)0x2b);
  testing::Matcher<BasicTestExpr<0>_>::Matcher(&local_1ca8,(BasicTestExpr<0>)0x2c);
  this_27 = &local_1c80.super_MockProblemBuilder.gmock3_MakeSymbolicIf_340;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_27,&local_1c80.super_MockProblemBuilder);
  this_82 = testing::internal::
            FunctionMocker<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
            ::With(this_27,&local_1cd8,&local_1cc0,&local_1ca8);
  this_83 = testing::internal::
            MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
            InternalExpectedAt(this_82,
                               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                               ,0x706,"builder",
                               "MakeSymbolicIf (TestLogicalExpr(ID), TestExpr(ID2), TestExpr(ID3))")
  ;
  local_1c90.value_ =
       (ActionInterface<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
       operator_new(0x10);
  (local_1c90.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002fbae0;
  *(undefined4 *)&local_1c90.value_[1]._vptr_ActionInterface = 0x2d;
  local_1c90.link_.next_ = plVar3;
  testing::internal::
  TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
  WillOnce(this_83,(Action<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
                    *)&local_1c90);
  testing::internal::
  linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>_>
                 *)&local_1c90);
  local_1ca8.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f2d50;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_>::~linked_ptr
            (&local_1ca8.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cc0.super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f2d50;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_>::~linked_ptr
            (&local_1cc0.super_MatcherBase<BasicTestExpr<0>_>.impl_);
  local_1cd8.super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3be8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_>::~linked_ptr
            (&local_1cd8.super_MatcherBase<BasicTestExpr<2>_>.impl_);
  MockProblemBuilder::MakeSymbolicIf
            (&local_1c80.super_MockProblemBuilder,(Argument1)0x2a,(Argument2)0x2b,(Argument3)0x2c);
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&local_1c80);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, Forward) {
  // Use the same StringRef object in arguments, because StringRef objects
  // are compared as pointers and string literals they point to may not
  // be merged.
  fmt::StringRef str("foo");
  EXPECT_FORWARD_RET(OnIntSuffix, AddIntSuffix, (str, mp::suf::OBJ, 11),
                     TestSuffixHandler<0>(ID));
  EXPECT_FORWARD_RET(OnDblSuffix, AddDblSuffix, (str, mp::suf::OBJ, 11),
                     TestSuffixHandler<1>(ID));

  EXPECT_FORWARD_RET(OnNumber, MakeNumericConstant,
                     (2.2), TestNumericExpr(ID));
  EXPECT_FORWARD_RET(OnVariableRef, MakeVariable, (33), TestReference(ID));
  EXPECT_FORWARD_RET(OnCommonExprRef, MakeCommonExpr, (33), TestReference(ID));
  EXPECT_FORWARD_RET(OnUnary, MakeUnary, (expr::ABS, TestNumericExpr(ID)),
                     TestNumericExpr(ID2));
  EXPECT_FORWARD_RET(OnBinary, MakeBinary,
                     (expr::ADD, TestNumericExpr(ID), TestNumericExpr(ID2)),
                     TestNumericExpr(ID3));
  EXPECT_FORWARD_RET(OnIf, MakeIf,
                     (TestLogicalExpr(ID), TestNumericExpr(ID2),
                      TestNumericExpr(ID3)), TestNumericExpr(ID4));

  EXPECT_FORWARD_RET(BeginPLTerm, BeginPLTerm, (44), TestPLTermBuilder(ID));
  EXPECT_FORWARD_RET(EndPLTerm, EndPLTerm,
                     (TestPLTermBuilder(ID), TestReference(ID2)),
                     TestNumericExpr(ID3));

  EXPECT_FORWARD_RET(BeginVarArg, BeginIterated, (expr::MAX, 77),
                     TestIteratedExprBuilder(ID));
  EXPECT_FORWARD_RET(EndVarArg, EndIterated, (TestIteratedExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginSum, BeginSum, (88),
                     TestIteratedExprBuilder(ID));
  EXPECT_FORWARD_RET(EndSum, EndSum, (TestIteratedExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginNumberOf, BeginNumberOf, (11, TestNumericExpr(ID)),
                     TestNumberOfExprBuilder(ID2));
  EXPECT_FORWARD_RET(EndNumberOf, EndNumberOf, (TestNumberOfExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginSymbolicNumberOf, BeginSymbolicNumberOf,
                     (11, TestExpr(ID)), TestSymbolicNumberOfExprBuilder(ID2));
  EXPECT_FORWARD_RET(EndSymbolicNumberOf, EndSymbolicNumberOf,
                     (TestSymbolicNumberOfExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginCount, BeginCount, (99), TestCountExprBuilder(ID));
  EXPECT_FORWARD_RET(EndCount, EndCount, (TestCountExprBuilder(ID)),
                     TestCountExpr(ID2));

  EXPECT_FORWARD_RET(OnBool, MakeLogicalConstant, (true), TestLogicalExpr(ID));
  EXPECT_FORWARD_RET(OnNot, MakeNot, (TestLogicalExpr(ID)),
                     TestLogicalExpr(ID2));
  EXPECT_FORWARD_RET(OnBinaryLogical, MakeBinaryLogical,
                     (expr::OR, TestLogicalExpr(ID), TestLogicalExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnRelational, MakeRelational,
                     (expr::LT, TestNumericExpr(ID), TestNumericExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnLogicalCount, MakeLogicalCount,
                     (expr::ATLEAST, TestNumericExpr(ID), TestCountExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnImplication, MakeImplication,
                     (TestLogicalExpr(ID), TestLogicalExpr(ID2),
                      TestLogicalExpr(ID3)), TestLogicalExpr(ID4));

  EXPECT_FORWARD_RET(BeginIteratedLogical, BeginIteratedLogical,
                     (expr::EXISTS, 22), TestIteratedLogicalExprBuilder(ID));
  EXPECT_FORWARD_RET(EndIteratedLogical, EndIteratedLogical,
                     (TestIteratedLogicalExprBuilder(ID)),
                     TestLogicalExpr(ID2));

  EXPECT_FORWARD_RET(BeginPairwise, BeginPairwise, (expr::ALLDIFF, 33),
                     TestPairwiseExprBuilder(ID));
  EXPECT_FORWARD_RET(EndPairwise, EndPairwise,
                     (TestPairwiseExprBuilder(ID)), TestLogicalExpr(ID2));

  EXPECT_FORWARD_RET(OnString, MakeStringLiteral, (str), TestExpr(ID));

  EXPECT_FORWARD_RET(OnSymbolicIf, MakeSymbolicIf,
                     (TestLogicalExpr(ID), TestExpr(ID2), TestExpr(ID3)),
                     TestExpr(ID4));
}